

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRenderer::DebugClasses
          (GdlRenderer *this,ostream *strmOut,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcReplcmt,
          int cpglfcLinear)

{
  int iVar1;
  GdlGlyphClassDefn *pGVar2;
  reference ppGVar3;
  ostream *poVar4;
  size_type_conflict sVar5;
  reference pvVar6;
  int in_ECX;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *in_RDX;
  GdlGlyphClassDefn *in_RSI;
  size_t iw_1;
  vector<int,_std::allocator<int>_> vnIndices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs_1;
  GdlGlyphClassDefn *pglfc_1;
  size_t iw;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs;
  GdlGlyphClassDefn *pglfc;
  int ipglfc;
  int cTmp;
  GdlGlyphClassDefn *in_stack_fffffffffffffea8;
  GdlGlyphClassDefn *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  ulong uVar7;
  gid16 wGlyphID;
  ostream *in_stack_fffffffffffffec0;
  ulong local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  undefined1 local_c0 [56];
  value_type local_88;
  ulong local_80;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  string local_50 [32];
  value_type local_30;
  int local_24;
  int local_20;
  int local_1c;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *local_18;
  GdlGlyphClassDefn *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::operator<<((ostream *)in_RSI,"LINEAR (OUTPUT) CLASSES");
  local_20 = 0;
  for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
    ppGVar3 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
                        (local_18,(long)local_24);
    local_30 = *ppGVar3;
    std::operator<<((ostream *)local_10,"\n\n");
    poVar4 = std::operator<<((ostream *)local_10,"Class #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
    std::operator<<(poVar4,": ");
    pGVar2 = local_10;
    GdlGlyphClassDefn::Name_abi_cxx11_(in_stack_fffffffffffffea8);
    std::operator<<((ostream *)pGVar2,local_50);
    std::__cxx11::string::~string(local_50);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x11e311);
    GdlGlyphClassDefn::GenerateOutputGlyphList
              (in_stack_fffffffffffffeb0,
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffea8)
    ;
    local_80 = 0;
    while( true ) {
      uVar7 = local_80;
      sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_78);
      if (sVar5 <= uVar7) break;
      if (local_80 % 10 == 0) {
        poVar4 = std::operator<<((ostream *)local_10,"\n");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_80);
        std::operator<<(poVar4,":");
      }
      std::operator<<((ostream *)local_10,"   ");
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&local_78,local_80);
      GrcManager::DebugHex
                (in_stack_fffffffffffffec0,(gid16)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
      local_80 = local_80 + 1;
    }
    local_20 = local_20 + 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffec0)
    ;
  }
  std::operator<<((ostream *)local_10,"\n\n\nINDEXED (INPUT) CLASSES");
  local_24 = local_1c;
  while( true ) {
    iVar1 = local_24;
    sVar5 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size(local_18);
    if ((int)sVar5 <= iVar1) break;
    ppGVar3 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
                        (local_18,(long)local_24);
    local_88 = *ppGVar3;
    std::operator<<((ostream *)local_10,"\n\n");
    poVar4 = std::operator<<((ostream *)local_10,"Class #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
    std::operator<<(poVar4,": ");
    pGVar2 = local_10;
    GdlGlyphClassDefn::Name_abi_cxx11_(in_stack_fffffffffffffea8);
    std::operator<<((ostream *)pGVar2,(string *)(local_c0 + 0x18));
    std::__cxx11::string::~string((string *)(local_c0 + 0x18));
    poVar4 = (ostream *)local_c0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x11e5a9);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11e5bb);
    GdlGlyphClassDefn::GenerateInputGlyphList
              (in_stack_fffffffffffffeb0,
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffea8,
               (vector<int,_std::allocator<int>_> *)0x11e5d2);
    local_e0 = 0;
    while( true ) {
      uVar7 = local_e0;
      sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c0);
      if (sVar5 <= uVar7) break;
      if (local_e0 % 5 == 0) {
        std::operator<<((ostream *)local_10,"\n");
      }
      wGlyphID = (gid16)(uVar7 >> 0x30);
      in_stack_fffffffffffffeb0 = local_10;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_c0,local_e0);
      GrcManager::DebugHex(poVar4,wGlyphID);
      std::operator<<((ostream *)local_10," :");
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,local_e0);
      if (*pvVar6 < 1000) {
        std::operator<<((ostream *)local_10," ");
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,local_e0);
      if (*pvVar6 < 100) {
        std::operator<<((ostream *)local_10," ");
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,local_e0);
      if (*pvVar6 < 10) {
        std::operator<<((ostream *)local_10," ");
      }
      in_stack_fffffffffffffea8 = local_10;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,local_e0);
      std::ostream::operator<<(in_stack_fffffffffffffea8,*pvVar6);
      std::operator<<((ostream *)local_10,"    ");
      local_e0 = local_e0 + 1;
    }
    local_20 = local_20 + 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar4);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)poVar4);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void GdlRenderer::DebugClasses(std::ostream & strmOut,
	std::vector<GdlGlyphClassDefn *> & vpglfcReplcmt, int cpglfcLinear)
{
	strmOut << "LINEAR (OUTPUT) CLASSES";

	//	linear classes (output)
	int cTmp = 0;
	int ipglfc;
	for (ipglfc = 0; ipglfc < cpglfcLinear; ipglfc++)
	{
		GdlGlyphClassDefn * pglfc = vpglfcReplcmt[ipglfc];

		Assert(pglfc->ReplcmtOutputClass() || pglfc->GlyphIDCount() <= 1);
		//Assert(pglfc->ReplcmtOutputID() == cTmp);

		strmOut << "\n\n";
		strmOut << "Class #" << ipglfc << ": ";
		strmOut << pglfc->Name();

		std::vector<utf16> vwGlyphs;
		pglfc->GenerateOutputGlyphList(vwGlyphs);

		//	glyph list
		for (size_t iw = 0; iw < vwGlyphs.size(); iw++)
		{
			if (iw % 10 == 0)
			{
				strmOut << "\n" << iw << ":";
			}
			strmOut << "   ";
			GrcManager::DebugHex(strmOut, vwGlyphs[iw]);
		}

		cTmp++;
	}

	strmOut << "\n\n\nINDEXED (INPUT) CLASSES";

	//	indexed classes (input)
	for (ipglfc = cpglfcLinear; ipglfc < signed(vpglfcReplcmt.size()); ipglfc++)
	{
		GdlGlyphClassDefn * pglfc = vpglfcReplcmt[ipglfc];

		Assert(pglfc->ReplcmtInputClass());
		Assert(pglfc->ReplcmtInputID() == cTmp);

		strmOut << "\n\n";
		strmOut << "Class #" << ipglfc << ": ";
		strmOut << pglfc->Name();

		std::vector<utf16> vwGlyphs;
		std::vector<int> vnIndices;
		pglfc->GenerateInputGlyphList(vwGlyphs, vnIndices);
		//	glyph list
		for (size_t iw = 0; iw < vwGlyphs.size(); iw++)
		{
			if (iw % 5 == 0)
			{
				strmOut << "\n";
			}
			GrcManager::DebugHex(strmOut, vwGlyphs[iw]);
			strmOut << " :";
			if (vnIndices[iw] < 1000) strmOut << " ";
			if (vnIndices[iw] < 100)  strmOut << " ";
			if (vnIndices[iw] < 10)   strmOut << " ";
			strmOut << vnIndices[iw];
			strmOut << "    ";
		}

		cTmp++;
	}
}